

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O3

void conversion_operator_suite::get_u32string(void)

{
  int iVar1;
  variable data;
  type local_108;
  basic_variable<std::allocator<char>_> local_e8;
  type local_b8;
  type local_98;
  type local_78;
  type local_58;
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  local_40;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::nullable>(&local_e8);
  boost::detail::throw_failed_impl
            ("data.operator nullable()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xed2,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_e8);
  boost::detail::throw_failed_impl
            ("data.operator bool()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xed5,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&local_e8);
  boost::detail::throw_failed_impl
            ("data.operator int()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xed8,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::value<float>(&local_e8);
  boost::detail::throw_failed_impl
            ("data.operator float()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xedb,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_78,(basic_variable<std::allocator<char>> *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xede,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_98,(basic_variable<std::allocator<char>> *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::wstring_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xee1,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_b8,(basic_variable<std::allocator<char>> *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity * 2 + 2);
  }
  boost::detail::throw_failed_impl
            ("data.operator variable::u16string_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xee4,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_108,(basic_variable<std::allocator<char>> *)&local_e8);
  iVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&local_108,L"delta");
  boost::detail::test_impl
            ("variable::u32string_type(data) == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xee5,"void conversion_operator_suite::get_u32string()",iVar1 == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity * 4 + 4);
  }
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
            (&local_58,(basic_variable<std::allocator<char>> *)&local_e8);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector(&local_58);
  boost::detail::throw_failed_impl
            ("data.operator variable::array_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xee8,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ((type *)&local_40,(basic_variable<std::allocator<char>> *)&local_e8);
  std::
  _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>_>,_std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::_Select1st<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  boost::detail::throw_failed_impl
            ("data.operator variable::map_type()","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xeeb,"void conversion_operator_suite::get_u32string()");
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_e8);
  return;
}

Assistant:

void get_u32string()
{
    variable data(U"delta");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator nullable(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator bool(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator int(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator float(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::wstring_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::u16string_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST(variable::u32string_type(data) == U"delta");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::array_type(),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator variable::map_type(),
                                    error,
                                    "incompatible type");
}